

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void map_delete_record(JSRuntime *rt,JSMapState *s,JSMapRecord *mr)

{
  JSValue v;
  JSValue v_00;
  int iVar1;
  JSMapRecord *in_RDX;
  int *in_RSI;
  JSRuntime *in_RDI;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  JSRuntime *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  int64_t in_stack_ffffffffffffffe0;
  
  if (in_RDX->empty == 0) {
    list_del(&in_RDX->hash_link);
    if (*in_RSI == 0) {
      v.u._4_4_ = in_stack_ffffffffffffffdc;
      v.u.int32 = in_stack_ffffffffffffffd8;
      v.tag = in_stack_ffffffffffffffe0;
      JS_FreeValueRT(in_stack_ffffffffffffffd0,v);
    }
    else {
      delete_weak_ref(in_RDI,in_RDX);
    }
    v_00.u._4_4_ = in_stack_ffffffffffffffdc;
    v_00.u.int32 = in_stack_ffffffffffffffd8;
    v_00.tag = in_stack_ffffffffffffffe0;
    JS_FreeValueRT(in_stack_ffffffffffffffd0,v_00);
    iVar1 = in_RDX->ref_count + -1;
    in_RDX->ref_count = iVar1;
    if (iVar1 == 0) {
      list_del(&in_RDX->link);
      js_free_rt(in_stack_ffffffffffffffd0,
                 (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      in_RDX->empty = 1;
      (in_RDX->key).u.ptr = (void *)((ulong)in_stack_ffffffffffffffdc << 0x20);
      (in_RDX->key).tag = 3;
      (in_RDX->value).u.ptr = (void *)((ulong)in_stack_ffffffffffffffcc << 0x20);
      (in_RDX->value).tag = 3;
    }
    in_RSI[6] = in_RSI[6] + -1;
  }
  return;
}

Assistant:

static void map_delete_record(JSRuntime *rt, JSMapState *s, JSMapRecord *mr)
{
    if (mr->empty)
        return;
    list_del(&mr->hash_link);
    if (s->is_weak) {
        delete_weak_ref(rt, mr);
    } else {
        JS_FreeValueRT(rt, mr->key);
    }
    JS_FreeValueRT(rt, mr->value);
    if (--mr->ref_count == 0) {
        list_del(&mr->link);
        js_free_rt(rt, mr);
    } else {
        /* keep a zombie record for iterators */
        mr->empty = TRUE;
        mr->key = JS_UNDEFINED;
        mr->value = JS_UNDEFINED;
    }
    s->record_count--;
}